

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void process_shader(GLuint *shader,char *source,GLint shader_type)

{
  GLuint GVar1;
  GLenum GVar2;
  GLenum glError_3;
  GLenum glError_2;
  GLenum glError_1;
  GLenum glError;
  GLsizei length;
  char buffer [1024];
  char *shaders [1];
  GLint status;
  GLint shader_type_local;
  char *source_local;
  GLuint *shader_local;
  
  shaders[0]._0_4_ = 0;
  shaders[0]._4_4_ = shader_type;
  memset(buffer + 0x3f8,0,8);
  GVar1 = (*ctx.glCreateShader)(shaders[0]._4_4_);
  *shader = GVar1;
  GVar2 = (*ctx.glGetError)();
  if (GVar2 != 0) {
    SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar2,GVar2,0xc6);
    quit(1);
  }
  buffer._1016_8_ = source;
  (*ctx.glShaderSource)(*shader,1,(GLchar **)(buffer + 0x3f8),(GLint *)0x0);
  GVar2 = (*ctx.glGetError)();
  if (GVar2 != 0) {
    SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar2,GVar2,0xca);
    quit(1);
  }
  buffer[0x3f8] = '\0';
  buffer[0x3f9] = '\0';
  buffer[0x3fa] = '\0';
  buffer[0x3fb] = '\0';
  buffer[0x3fc] = '\0';
  buffer[0x3fd] = '\0';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  (*ctx.glCompileShader)(*shader);
  GVar2 = (*ctx.glGetError)();
  if (GVar2 != 0) {
    SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar2,GVar2,0xd0);
    quit(1);
  }
  (*ctx.glGetShaderiv)(*shader,0x8b81,(GLint *)shaders);
  GVar2 = (*ctx.glGetError)();
  if (GVar2 != 0) {
    SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar2,GVar2,0xd1);
    quit(1);
  }
  if ((int)shaders[0] != 1) {
    (*ctx.glGetProgramInfoLog)(*shader,0x400,(GLsizei *)&glError_1,(GLchar *)&glError);
    *(undefined1 *)((long)&glError + (long)(int)glError_1) = 0;
    SDL_Log("Shader compilation failed: %s",&glError);
    fflush(_stderr);
    quit(-1);
  }
  return;
}

Assistant:

void 
process_shader(GLuint *shader, const char * source, GLint shader_type)
{
    GLint status = GL_FALSE;
    const char *shaders[1] = { NULL };
    char buffer[1024];
    GLsizei length;

    /* Create shader and load into GL. */
    *shader = GL_CHECK(ctx.glCreateShader(shader_type));

    shaders[0] = source;

    GL_CHECK(ctx.glShaderSource(*shader, 1, shaders, NULL));

    /* Clean up shader source. */
    shaders[0] = NULL;

    /* Try compiling the shader. */
    GL_CHECK(ctx.glCompileShader(*shader));
    GL_CHECK(ctx.glGetShaderiv(*shader, GL_COMPILE_STATUS, &status));

    /* Dump debug info (source and log) if compilation failed. */
    if(status != GL_TRUE) {
        ctx.glGetProgramInfoLog(*shader, sizeof(buffer), &length, &buffer[0]);
        buffer[length] = '\0';
        SDL_Log("Shader compilation failed: %s", buffer);fflush(stderr);
        quit(-1);
    }
}